

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

bool __thiscall duckdb::TemporaryFileHandle::DeleteIfEmpty(TemporaryFileHandle *this)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var2;
  pthread_mutex_t *in_RAX;
  FileSystem *pFVar3;
  TemporaryFileLock lock;
  lock_guard<std::mutex> local_18;
  
  local_18._M_device = (mutex_type *)in_RAX;
  TemporaryFileLock::TemporaryFileLock((TemporaryFileLock *)&local_18,&this->file_lock);
  iVar1 = (this->index_manager).max_index;
  if (iVar1 == 0) {
    _Var2._M_head_impl =
         (this->handle).
         super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
    (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
    _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
    super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
    if (_Var2._M_head_impl != (FileHandle *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_FileHandle + 8))();
    }
    pFVar3 = FileSystem::GetFileSystem(this->db);
    (*pFVar3->_vptr_FileSystem[0x14])(pFVar3,&this->path,0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)local_18._M_device);
  return iVar1 == 0;
}

Assistant:

bool TemporaryFileHandle::DeleteIfEmpty() {
	TemporaryFileLock lock(file_lock);
	if (index_manager.GetMaxIndex() > 0) {
		// there are still blocks in this file
		return false;
	}
	// the file is empty: delete it
	handle.reset();
	auto &fs = FileSystem::GetFileSystem(db);
	fs.RemoveFile(path);
	return true;
}